

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

bool __thiscall
iDynTree::MatrixDynSize::setVal(MatrixDynSize *this,size_t row,size_t col,double new_el)

{
  if ((row <= this->m_rows) && (col <= this->m_cols)) {
    this->m_data[this->m_cols * row + col] = new_el;
    return true;
  }
  reportError("MatrixDynSize","setVal","indices out of bounds");
  return false;
}

Assistant:

bool MatrixDynSize::setVal(const std::size_t row, const std::size_t col, const double new_el)
{
    if( row > this->rows() ||
        col   > this->cols() )
    {
        reportError("MatrixDynSize","setVal","indices out of bounds");
        return false;
    }

    this->m_data[rawIndexRowMajor(row,col)] = new_el;
    return true;
}